

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int setsbf(match *res,int pos,int len,ull num)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ull a1;
  ull m1;
  ull a;
  ull m;
  int idx;
  ull num_local;
  int len_local;
  int pos_local;
  match *res_local;
  
  if (len == 0) {
    res_local._4_4_ = 1;
  }
  else {
    iVar1 = pos / 0x40;
    bVar4 = (byte)(pos % 0x40);
    uVar2 = (1L << ((byte)len & 0x3f)) + -1 << (bVar4 & 0x3f);
    uVar3 = num << (bVar4 & 0x3f) & uVar2;
    if ((uVar3 & uVar2 & res->m[iVar1]) == (res->a[iVar1] & uVar2 & res->m[iVar1])) {
      res->a[iVar1] = uVar3 | res->a[iVar1];
      res->m[iVar1] = uVar2 | res->m[iVar1];
      if (0x40 < pos % 0x40 + len) {
        uVar2 = (1L << ((byte)len & 0x3f)) - 1U >> (0x40 - bVar4 & 0x3f);
        uVar3 = num >> (0x40 - bVar4 & 0x3f) & uVar2;
        if ((uVar3 & uVar2 & res->m[iVar1 + 1]) != (res->a[iVar1 + 1] & uVar2 & res->m[iVar1 + 1]))
        {
          return 0;
        }
        res->a[iVar1 + 1] = uVar3 | res->a[iVar1 + 1];
        res->m[iVar1 + 1] = uVar2 | res->m[iVar1 + 1];
      }
      res_local._4_4_ = 1;
    }
    else {
      res_local._4_4_ = 0;
    }
  }
  return res_local._4_4_;
}

Assistant:

int setsbf (struct match *res, int pos, int len, ull num) {
	if (!len)
		return 1;
	int idx = pos / 0x40;
	pos %= 0x40;
	ull m = ((1ull << len) - 1) << pos;
	ull a = (num << pos) & m;
	if ((a & m & res->m[idx]) == (res->a[idx] & m & res->m[idx])) {
		res->a[idx] |= a;
		res->m[idx] |= m;
	} else {
		return 0;
	}
	if (pos + len > 0x40) {
		ull m1 = (((1ull << len) - 1) >> (0x40 - pos));
		ull a1 = (num >> (0x40 - pos)) & m1;
		if ((a1 & m1 & res->m[idx+1]) == (res->a[idx+1] & m1 & res->m[idx+1])) {
			res->a[idx+1] |= a1;
			res->m[idx+1] |= m1;
		} else {
			return 0;
		}
	}
	return 1;
}